

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O1

VP8StatusCode CheckDecBuffer(WebPDecBuffer *buffer)

{
  WEBP_CSP_MODE WVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  
  WVar1 = buffer->colorspace;
  if ((ulong)WVar1 < 0xd) {
    iVar2 = buffer->width;
    lVar8 = (long)iVar2;
    iVar3 = buffer->height;
    if (WVar1 < MODE_YUV) {
      uVar4 = (buffer->u).RGBA.stride;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      bVar9 = ((buffer->u).RGBA.rgba != (uint8_t *)0x0 &&
              (int)(lVar8 * (ulong)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[WVar1]) <=
              (int)uVar5) &&
              lVar8 * (ulong)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[WVar1] +
              (long)(iVar3 + -1) * (ulong)uVar5 <= (buffer->u).RGBA.size;
    }
    else {
      iVar10 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
      uVar4 = (buffer->u).YUVA.y_stride;
      uVar5 = (buffer->u).YUVA.u_stride;
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      uVar5 = (buffer->u).YUVA.v_stride;
      uVar7 = -uVar5;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      lVar11 = (long)(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + -1);
      bVar9 = ((buffer->u).RGBA.size != 0 &&
              ((buffer->u).YUVA.u != (uint8_t *)0x0 &&
              ((buffer->u).RGBA.rgba != (uint8_t *)0x0 &&
              (iVar10 <= (int)uVar7 && iVar10 <= (int)uVar4)))) &&
              ((iVar2 <= (int)uVar6 &&
               lVar11 * (ulong)uVar7 + (long)iVar10 <= (buffer->u).YUVA.v_size) &&
              ((ulong)uVar4 * lVar11 + (long)iVar10 <= (buffer->u).YUVA.u_size &&
              (ulong)uVar6 * ((long)iVar3 + -1) + lVar8 <= (buffer->u).YUVA.y_size));
      if (WVar1 == MODE_YUVA) {
        uVar4 = (buffer->u).YUVA.a_stride;
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        bVar9 = bVar9 && (((buffer->u).YUVA.a != (uint8_t *)0x0 && iVar2 <= (int)uVar5) &&
                         ((long)iVar3 + -1) * (ulong)uVar5 + lVar8 <= (buffer->u).YUVA.a_size);
      }
    }
  }
  else {
    bVar9 = false;
  }
  return (uint)(bVar9 ^ 1) * 2;
}

Assistant:

static VP8StatusCode CheckDecBuffer(const WebPDecBuffer* const buffer) {
  int ok = 1;
  const WEBP_CSP_MODE mode = buffer->colorspace;
  const int width = buffer->width;
  const int height = buffer->height;
  if (!IsValidColorspace(mode)) {
    ok = 0;
  } else if (!WebPIsRGBMode(mode)) {   // YUV checks
    const WebPYUVABuffer* const buf = &buffer->u.YUVA;
    const int uv_width  = (width  + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int y_stride = abs(buf->y_stride);
    const int u_stride = abs(buf->u_stride);
    const int v_stride = abs(buf->v_stride);
    const int a_stride = abs(buf->a_stride);
    const uint64_t y_size = MIN_BUFFER_SIZE(width, height, y_stride);
    const uint64_t u_size = MIN_BUFFER_SIZE(uv_width, uv_height, u_stride);
    const uint64_t v_size = MIN_BUFFER_SIZE(uv_width, uv_height, v_stride);
    const uint64_t a_size = MIN_BUFFER_SIZE(width, height, a_stride);
    ok &= (y_size <= buf->y_size);
    ok &= (u_size <= buf->u_size);
    ok &= (v_size <= buf->v_size);
    ok &= (y_stride >= width);
    ok &= (u_stride >= uv_width);
    ok &= (v_stride >= uv_width);
    ok &= (buf->y != NULL);
    ok &= (buf->u != NULL);
    ok &= (buf->v != NULL);
    if (mode == MODE_YUVA) {
      ok &= (a_stride >= width);
      ok &= (a_size <= buf->a_size);
      ok &= (buf->a != NULL);
    }
  } else {    // RGB checks
    const WebPRGBABuffer* const buf = &buffer->u.RGBA;
    const int stride = abs(buf->stride);
    const uint64_t size =
        MIN_BUFFER_SIZE(width * kModeBpp[mode], height, stride);
    ok &= (size <= buf->size);
    ok &= (stride >= width * kModeBpp[mode]);
    ok &= (buf->rgba != NULL);
  }
  return ok ? VP8_STATUS_OK : VP8_STATUS_INVALID_PARAM;
}